

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku_chain.cpp
# Opt level: O1

void __thiscall
SudokuChain::print(SudokuChain *this,PrintTarget target,string *filename,PrintMode mode)

{
  pointer psVar1;
  element_type *peVar2;
  ChainedSudoku *this_00;
  pointer pcVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  pointer psVar7;
  ofstream file;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  if (target == svg_file_body) {
    std::ofstream::ofstream((ostream *)&local_230,(filename->_M_dataplus)._M_p,_S_trunc|_S_out);
    iVar6 = this->nFieldsX_;
    iVar5 = this->nFieldsY_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<svg width=\"",
               0x33);
    poVar4 = std::ostream::_M_insert<double>((double)(iVar6 * 0x1e));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" height=\"",10);
    poVar4 = std::ostream::_M_insert<double>((double)(iVar5 * 0x1e));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\">\n<g>\n",7);
    std::ofstream::close();
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  psVar7 = (this->sudokuSpecifications_).
           super__Vector_base<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->sudokuSpecifications_).
           super__Vector_base<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar1) {
    iVar5 = 0;
    iVar6 = -this->coordinateYbottom_;
    do {
      peVar2 = (psVar7->
               super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar5 = iVar5 + peVar2->offset_from_previous_x;
      iVar6 = iVar6 + peVar2->offset_from_previous_y;
      this_00 = *(ChainedSudoku **)(*(long *)&this->sudoku_ + (long)peVar2->sudoku_no * 0x10);
      pcVar3 = (filename->_M_dataplus)._M_p;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar3,pcVar3 + filename->_M_string_length);
      ChainedSudoku::print
                (this_00,target,&local_250,mode,iVar5,iVar6,
                 ((psVar7->
                  super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->sudoku_no);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar1);
  }
  if (target == svg_file_body) {
    std::ofstream::ofstream((ostream *)&local_230,(filename->_M_dataplus)._M_p,_S_out|_S_app);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n</g>\n</svg>\n",0xd)
    ;
    std::ofstream::close();
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void SudokuChain::print(ChainedSudoku::PrintTarget target, std::string filename, ChainedSudoku::PrintMode mode)
{
  if(target == ChainedSudoku::PrintTarget::svg_file_body)
  {
    // begin svg file
    std::ofstream file(filename.c_str(), std::ios::out | std::ios::trunc);
    double width = 30*nFieldsX_;
    double height = 30*nFieldsY_;
    file<<"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<svg width=\""<<width<<"\" height=\""<<height<<"\">\n<g>\n";
    file.close();
  }

  int offset_x = 0;
  int offset_y = -coordinateYbottom_;
  for(auto& specification : sudokuSpecifications_)
  {
    offset_x += specification->offset_from_previous_x;
    offset_y += specification->offset_from_previous_y;
    sudoku_[specification->sudoku_no]->print(target, filename, mode, offset_x, offset_y, specification->sudoku_no+number_offset);
  }

  if(target == ChainedSudoku::PrintTarget::svg_file_body)
  {
    // end svg file
    std::ofstream file(filename.c_str(), std::ios::out | std::ios::app);
    file<<"\n</g>\n</svg>\n";
    file.close();
  }
}